

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O1

bool ver_is_valid_magic(filemgr_magic_t magic)

{
  bool bVar1;
  
  bVar1 = true;
  if ((1 < magic + 0x2152350141103fff) && (magic != 0xdeadcafebeefbeef)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ver_is_valid_magic(filemgr_magic_t magic)
{
    if ( magic == FILEMGR_MAGIC_000 ||
        (magic >= FILEMGR_MAGIC_001 && magic <= FILEMGR_LATEST_MAGIC)) {
        return true;
    }
    return false;
}